

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getrss.c
# Opt level: O3

size_t getPeakRSS(void)

{
  rusage rusage;
  rusage rStack_98;
  
  getrusage(RUSAGE_SELF,&rStack_98);
  return rStack_98.ru_maxrss << 10;
}

Assistant:

size_t
getPeakRSS()
{
#if defined(_WIN32)
	PROCESS_MEMORY_COUNTERS info;
	GetProcessMemoryInfo( GetCurrentProcess( ), &info, sizeof(info) );
	return (size_t)info.PeakWorkingSetSize;
#else
    struct rusage rusage;
    getrusage(RUSAGE_SELF, &rusage);
#if defined(__APPLE__) && defined(__MACH__)
    return (size_t)rusage.ru_maxrss;
#else
    return (size_t)(rusage.ru_maxrss * 1024L);
#endif
#endif
}